

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::SurrogatePairPass1
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  undefined1 *puVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  Node *pNVar7;
  AltNode *pAVar8;
  AltNode *pAVar9;
  SurrogatePairTracker *pSVar10;
  EncodedChar *pEVar11;
  EncodedChar *pEVar12;
  codepoint_t codePointValue;
  uint uVar13;
  int i;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  AltNode *local_88;
  Node *equivNode [4];
  codepoint_t local_58 [2];
  codepoint_t equivClass [4];
  uint tableIndex;
  uint actualHigh;
  char16 local_34;
  char16 local_32 [3];
  char16 lower;
  char16 upper;
  
  if ((((((this->scriptContext->config).threadConfig)->m_ES6Unicode != true) ||
       (this->unicodeFlagPresent != true)) ||
      (pSVar10 = this->currentSurrogatePairNode, pSVar10 == (SurrogatePairTracker *)0x0)) ||
     (pSVar10->location != this->next)) {
    return false;
  }
  if (pSVar10->rangeLocation != (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x723,"(!this->currentSurrogatePairNode->IsInsideRange())",
                       "Should not be calling this pass if we are currently inside a range.");
    if (!bVar4) goto LAB_00ed7575;
    *puVar5 = 0;
    pSVar10 = this->currentSurrogatePairNode;
  }
  equivClass[2] = 0;
  equivClass[3] = 0;
  if (this->caseInsensitiveFlagPresent == true) {
    bVar4 = CaseInsensitive::RangeToEquivClass
                      (equivClass + 2,pSVar10->value,pSVar10->value,equivClass + 3,local_58);
    if (!bVar4) {
      pSVar10 = this->currentSurrogatePairNode;
      goto LAB_00ed7314;
    }
    lVar14 = 0;
    uVar13 = 0;
    do {
      codePointValue = local_58[0];
      if (lVar14 != 0) {
        codePointValue = local_58[lVar14];
        lVar6 = 0;
        do {
          if (codePointValue == local_58[lVar6]) goto LAB_00ed72e8;
          lVar6 = lVar6 + 1;
        } while (lVar14 != lVar6);
      }
      bVar4 = Js::NumberUtilities::IsInSupplementaryPlane(codePointValue);
      if (bVar4) {
        Js::NumberUtilities::CodePointAsSurrogatePair(local_58[lVar14],&local_34,local_32);
        pNVar7 = CreateSurrogatePairAtom(this,local_34,local_32[0]);
      }
      else {
        pNVar7 = (Node *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x364470);
        uVar2 = local_58[lVar14];
        pNVar7->tag = MatchChar;
        pNVar7->features = 0;
        *(uint *)&pNVar7->field_0xc = *(uint *)&pNVar7->field_0xc & 0xffff8000;
        pNVar7->firstSet = (CharSet<char16_t> *)0x0;
        pNVar7->followSet = (CharSet<char16_t> *)0x0;
        (pNVar7->prevConsumes).lower = 0;
        (pNVar7->prevConsumes).upper = 0xffffffff;
        (pNVar7->thisConsumes).lower = 0;
        (pNVar7->thisConsumes).upper = 0xffffffff;
        (pNVar7->followConsumes).lower = 0;
        (pNVar7->followConsumes).upper = 0xffffffff;
        pNVar7->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
        *(undefined1 *)&pNVar7[1].tag = Empty;
        auVar16 = pshuflw(ZEXT416(uVar2),ZEXT416(uVar2),0);
        pNVar7[1]._vptr_Node = auVar16._0_8_;
      }
      equivNode[(long)(int)uVar13 + -1] = pNVar7;
      uVar13 = uVar13 + 1;
LAB_00ed72e8:
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    if ((int)uVar13 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x748,"(indexForNextNode > 0)","indexForNextNode > 0");
      if (!bVar4) goto LAB_00ed7575;
      *puVar5 = 0;
LAB_00ed739e:
      pAVar8 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x364470);
      AltNode::AltNode(pAVar8,&local_88->super_Node,(AltNode *)0x0);
      local_88 = pAVar8;
      if (1 < (int)uVar13) {
        uVar15 = 1;
        equivNode[3] = (Node *)&PTR_LiteralLength_01542cb0;
        do {
          pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x364470);
          pNVar7 = equivNode[uVar15 - 1];
          (pAVar9->super_Node).tag = Alt;
          (pAVar9->super_Node).features = 0;
          puVar1 = &(pAVar9->super_Node).field_0xc;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
          (pAVar9->super_Node).prevConsumes.lower = 0;
          (pAVar9->super_Node).firstSet = (CharSet<char16_t> *)0x0;
          (pAVar9->super_Node).followSet = (CharSet<char16_t> *)0x0;
          *(undefined8 *)&(pAVar9->super_Node).prevConsumes.upper = 0xffffffff;
          *(undefined8 *)&(pAVar9->super_Node).thisConsumes.upper = 0xffffffff;
          (pAVar9->super_Node).followConsumes.upper = 0xffffffff;
          (pAVar9->super_Node)._vptr_Node = (_func_int **)equivNode[3];
          pAVar9->head = pNVar7;
          pAVar9->switchSize = 0;
          pAVar9->tail = (AltNode *)0x0;
          pAVar9->runtimeTrie = (RuntimeCharTrie *)0x0;
          *(undefined8 *)((long)&pAVar9->runtimeTrie + 5) = 0;
          pAVar8->tail = pAVar9;
          uVar15 = uVar15 + 1;
          pAVar8 = pAVar9;
        } while (uVar13 != uVar15);
      }
    }
    else if (uVar13 != 1) goto LAB_00ed739e;
    *node = &local_88->super_Node;
  }
  else {
LAB_00ed7314:
    Js::NumberUtilities::CodePointAsSurrogatePair(pSVar10->value,&local_34,local_32);
    pNVar7 = CreateSurrogatePairAtom(this,local_34,local_32[0]);
    *node = pNVar7;
  }
  *previousSurrogatePart = false;
  pSVar10 = this->currentSurrogatePairNode;
  uVar15 = (ulong)pSVar10->length;
  pEVar12 = this->inputLim;
  pEVar11 = this->next;
  if (pEVar12 < pEVar11 + uVar15) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x761,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                       "ECCanConsume(this->currentSurrogatePairNode->length)");
    if (!bVar4) goto LAB_00ed7575;
    *puVar5 = 0;
    pSVar10 = this->currentSurrogatePairNode;
    uVar15 = (ulong)pSVar10->length;
    pEVar12 = this->inputLim;
    pEVar11 = this->next;
  }
  if (pEVar12 < pEVar11 + uVar15) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xde,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar4) {
LAB_00ed7575:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pEVar11 = this->next;
    pSVar10 = this->currentSurrogatePairNode;
  }
  this->next = pEVar11 + uVar15;
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = pSVar10->multiUnits;
  this->currentSurrogatePairNode = pSVar10->next;
  return true;
}

Assistant:

bool Parser<P, IsLiteral>::SurrogatePairPass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        if (!this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() || !unicodeFlagPresent)
        {
            return false;
        }

        if (this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
        {
            AssertMsg(!this->currentSurrogatePairNode->IsInsideRange(), "Should not be calling this pass if we are currently inside a range.");
            char16 lower, upper;

            uint tableIndex = 0, actualHigh = 0;
            codepoint_t equivClass[CaseInsensitive::EquivClassSize];

            if (caseInsensitiveFlagPresent && CaseInsensitive::RangeToEquivClass(tableIndex, this->currentSurrogatePairNode->value, this->currentSurrogatePairNode->value, actualHigh, equivClass))
            {
                Node *equivNode[CaseInsensitive::EquivClassSize];
                int indexForNextNode = 0;
                for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
                {
                    bool alreadyAdded = false;

                    for (int j = 0; j < i; j++)
                    {
                        if (equivClass[i] == equivClass[j])
                        {
                            alreadyAdded = true;
                            break;
                        }
                    }

                    if (!alreadyAdded)
                    {
                        if (Js::NumberUtilities::IsInSupplementaryPlane(equivClass[i]))
                        {
                            Js::NumberUtilities::CodePointAsSurrogatePair(equivClass[i], &lower, &upper);
                            equivNode[indexForNextNode] = CreateSurrogatePairAtom(lower, upper);
                        }
                        else
                        {
                            equivNode[indexForNextNode] = Anew(ctAllocator, MatchCharNode, (Char)equivClass[i]);
                        }
                        indexForNextNode ++;
                    }
                }
                Assert(indexForNextNode > 0);
                if (indexForNextNode == 1)
                {
                    node = equivNode[0];
                }
                else
                {
                    AltNode *altNode = Anew(ctAllocator, AltNode, equivNode[0], nullptr);
                    AltNode *altNodeTail = altNode;
                    for (int i = 1; i < indexForNextNode; i++)
                    {
                        altNodeTail->tail = Anew(ctAllocator, AltNode, equivNode[i], nullptr);
                        altNodeTail = altNodeTail->tail;
                    }
                    node = altNode;
                }
            }
            else
            {
                Js::NumberUtilities::CodePointAsSurrogatePair(this->currentSurrogatePairNode->value, &lower, &upper);
                node = CreateSurrogatePairAtom(lower, upper);
            }

            previousSurrogatePart = false;

            Assert(ECCanConsume(this->currentSurrogatePairNode->length));
            ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
            this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
            this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;

            return true;
        }

        return false;
    }